

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_compute_eflags(DisasContext *s)

{
  CCOp CVar1;
  TCGContext *tcg_ctx;
  ulong uVar2;
  uintptr_t o;
  TCGv_i64 pTVar3;
  uintptr_t o_2;
  TCGv_i64 pTVar4;
  uintptr_t o_1;
  TCGv_i64 pTVar5;
  byte bVar6;
  TCGv_i64 local_68;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_i64 local_48;
  TCGv_i32 local_40;
  
  CVar1 = s->cc_op;
  uVar2 = (ulong)CVar1;
  if (uVar2 != 1) {
    tcg_ctx = s->uc->tcg_ctx;
    if (CVar1 == CC_OP_CLR) {
      tcg_gen_movi_i64_x86_64(tcg_ctx,tcg_ctx->cpu_cc_src,0x44);
      set_cc_op(s,CC_OP_EFLAGS);
      return;
    }
    pTVar4 = tcg_ctx->cpu_cc_dst;
    pTVar3 = tcg_ctx->cpu_cc_src;
    pTVar5 = tcg_ctx->cpu_cc_src2;
    if ((0x10000003c3c01U >> (uVar2 & 0x3f) & 1) == 0) {
      bVar6 = "\a\x02\x03\x03\x03\x03\x03\x03\x03\x03\a\a\a\a\v\v\v\v\a\a\a\a\x01\x01\x01\x01\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x06\a"
              [uVar2] ^ 7;
      local_68 = tcg_const_i64_x86_64(tcg_ctx,0);
      if ((bVar6 & 1) != 0) {
        pTVar4 = local_68;
      }
      if ((bVar6 & 2) != 0) {
        pTVar3 = local_68;
      }
      if ((bVar6 & 4) != 0) {
        pTVar5 = local_68;
      }
    }
    else {
      local_68 = (TCGv_i64)0x0;
    }
    gen_update_cc_op(s);
    local_40 = tcg_ctx->cpu_cc_op + (long)tcg_ctx;
    local_58 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    local_50 = pTVar3 + (long)tcg_ctx;
    local_48 = pTVar5 + (long)tcg_ctx;
    tcg_gen_callN_x86_64
              (tcg_ctx,helper_cc_compute_all_x86_64,(TCGTemp *)(tcg_ctx->cpu_cc_src + (long)tcg_ctx)
               ,4,&local_58);
    set_cc_op(s,CC_OP_EFLAGS);
    if ((0x10000003c3c01U >> ((byte)CVar1 & 0x3f) & 1) == 0) {
      tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(local_68 + (long)tcg_ctx));
    }
  }
  return;
}

Assistant:

static void gen_compute_eflags(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv zero, dst, src1, src2;
    int live, dead;

    if (s->cc_op == CC_OP_EFLAGS) {
        return;
    }
    if (s->cc_op == CC_OP_CLR) {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_cc_src, CC_Z | CC_P);
        set_cc_op(s, CC_OP_EFLAGS);
        return;
    }

    zero = NULL;
    dst = tcg_ctx->cpu_cc_dst;
    src1 = tcg_ctx->cpu_cc_src;
    src2 = tcg_ctx->cpu_cc_src2;

    /* Take care to not read values that are not live.  */
    live = cc_op_live[s->cc_op] & ~USES_CC_SRCT;
    dead = live ^ (USES_CC_DST | USES_CC_SRC | USES_CC_SRC2);
    if (dead) {
        zero = tcg_const_tl(tcg_ctx, 0);
        if (dead & USES_CC_DST) {
            dst = zero;
        }
        if (dead & USES_CC_SRC) {
            src1 = zero;
        }
        if (dead & USES_CC_SRC2) {
            src2 = zero;
        }
    }

    gen_update_cc_op(s);
    gen_helper_cc_compute_all(tcg_ctx, tcg_ctx->cpu_cc_src, dst, src1, src2, tcg_ctx->cpu_cc_op);
    set_cc_op(s, CC_OP_EFLAGS);

    if (dead) {
        tcg_temp_free(tcg_ctx, zero);
    }
}